

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_charcode.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
iutest::detail::CodeConvert<char32_t,char,__mbstate_t>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,detail *this,char32_t *str)

{
  undefined1 local_78 [8];
  wstring_convert<iutest::detail::codecvt<char32_t,_char,___mbstate_t>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  conv;
  char32_t *str_local;
  
  conv._88_8_ = this;
  std::__cxx11::
  wstring_convert<iutest::detail::codecvt<char32_t,_char,___mbstate_t>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  ::wstring_convert((wstring_convert<iutest::detail::codecvt<char32_t,_char,___mbstate_t>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
                     *)local_78);
  std::__cxx11::
  wstring_convert<iutest::detail::codecvt<char32_t,_char,___mbstate_t>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  ::to_bytes(__return_storage_ptr__,
             (wstring_convert<iutest::detail::codecvt<char32_t,_char,___mbstate_t>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
              *)local_78,(char32_t *)conv._88_8_);
  std::__cxx11::
  wstring_convert<iutest::detail::codecvt<char32_t,_char,___mbstate_t>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  ::~wstring_convert((wstring_convert<iutest::detail::codecvt<char32_t,_char,___mbstate_t>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
                      *)local_78);
  return __return_storage_ptr__;
}

Assistant:

::std::basic_string<Out> CodeConvert(const In* str)
{
    ::std::wstring_convert< codecvt<In, Out, State>, In> conv;
    //::std::wstring_convert< codecvt<In, Out, State>, In> conv(&::std::use_facet< ::std::codecvt<In, Out, State> >(loc) );
    return conv.to_bytes(str);
}